

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmStateSnapshot *this_00;
  cmListFileBacktrace *value;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  cmake *this_02;
  cmListFileFunction *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  pointer __p;
  string *psVar8;
  const_iterator cVar9;
  pointer __p_00;
  cmListFileFunction *pcVar10;
  long lVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  unsigned_long *puVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<cmListFileArgument> __l;
  string_view value_00;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  cmListFile listFile;
  string currentStart;
  cmListFileFunction project;
  string filesDir;
  BuildsystemFileScope scope;
  undefined1 local_260 [38];
  allocator_type local_23a;
  undefined1 local_239;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_218;
  size_t local_210;
  unsigned_long *local_208;
  undefined8 local_200;
  unsigned_long local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  undefined8 local_1e0;
  cmListFile local_1d8;
  unsigned_long *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  string local_178;
  cmListFileBacktrace *local_158;
  value_type local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_100;
  long local_e8 [2];
  BuildsystemFileScope local_d8;
  cmListFileContext local_a0;
  
  this_00 = &this->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_238,this_00);
  psVar8 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_238);
  local_d8.GG = (cmGlobalGenerator *)(psVar8->_M_dataplus)._M_p;
  local_d8.Makefile = (cmMakefile *)psVar8->_M_string_length;
  local_d8.CurrentMakefile = (cmMakefile *)0xf;
  local_d8.Snapshot.State = (cmState *)0x6ade9b;
  views._M_len = 2;
  views._M_array = (iterator)&local_d8;
  cmCatViews_abi_cxx11_(&local_178,views);
  cmListFileContext::FromListFilePath(&local_a0,&local_178);
  value = &this->Backtrace;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_238,
             (cmListFileContext *)value);
  uVar4 = local_238._8_8_;
  uVar3 = local_238._0_8_;
  local_238._0_8_ = (element_type *)0x0;
  local_238._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  this_01 = (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar3;
  (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._8_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
  }
  if ((local_a0.DeferId.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (local_a0.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     local_a0.DeferId.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     ((pointer)
     ((long)&local_a0.DeferId.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     + 0x10U))._M_p)) {
    operator_delete((void *)local_a0.DeferId.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    local_a0.DeferId.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.FilePath._M_dataplus._M_p != &local_a0.FilePath.field_2) {
    operator_delete(local_a0.FilePath._M_dataplus._M_p,
                    local_a0.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
    operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1);
  }
  BuildsystemFileScope::BuildsystemFileScope(&local_d8,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_238,this_00);
  psVar8 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_238);
  local_260._8_8_ = (psVar8->_M_dataplus)._M_p;
  local_260._0_8_ = psVar8->_M_string_length;
  local_260._16_8_ = 0xb;
  local_260._24_8_ = "/CMakeFiles";
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_260;
  cmCatViews_abi_cxx11_(&local_120,views_00);
  cmsys::SystemTools::MakeDirectory(&local_120,(mode_t *)0x0);
  bVar6 = cmsys::SystemTools::FileExists(&local_178,true);
  if (!bVar6) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                  ,0x655,"void cmMakefile::Configure()");
  }
  local_238._0_8_ = &local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"CMAKE_PARENT_LIST_FILE","");
  value_00._M_str = local_178._M_dataplus._M_p;
  value_00._M_len = local_178._M_string_length;
  AddDefinition(this,(string *)local_238,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._0_8_ != &local_228) {
    operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_allocated_capacity + 1));
  }
  local_1d8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (cmListFileFunction *)0x0;
  local_1d8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (cmListFileFunction *)0x0;
  local_1d8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = cmListFile::ParseFile
                    (&local_1d8,local_178._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,value);
  if (!bVar6) goto LAB_001a5620;
  cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_238,this_00);
  bVar6 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_238);
  pcVar5 = local_1d8.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_158 = value;
  if (!bVar6) {
    pcVar2 = local_1d8.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_1d8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_1d8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_001a4e99:
      if ((ulong)((long)local_1d8.Functions.
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1d8.Functions.
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_start) < 0x1e0) {
        local_228._8_8_ = local_238 + 8;
        local_238._8_8_ = local_238._8_8_ & 0xffffffff00000000;
        local_228._M_allocated_capacity = 0;
        local_210 = 0;
        pcVar1 = local_260 + 0x10;
        local_260._0_8_ = pcVar1;
        local_218 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_228._8_8_;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"project","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"set","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"if","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"endif","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"else","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"elseif","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"add_executable","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"add_library","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"target_link_libraries","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"option","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        local_260._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"message","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((pointer)local_260._0_8_ != pcVar1) {
          operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
        }
        pcVar5 = local_1d8.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (local_1d8.Functions.
            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_1d8.Functions.
            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_238);
        }
        else {
          bVar6 = false;
          pcVar2 = local_1d8.Functions.
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar10 = pcVar2 + 1;
            cVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_238,
                           &((pcVar2->Impl).
                             super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->LowerCaseName);
            if (cVar9._M_node == (_Base_ptr)(local_238 + 8)) {
              bVar6 = true;
              break;
            }
            pcVar2 = pcVar10;
          } while (pcVar10 != pcVar5);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_238);
          if (bVar6) goto LAB_001a5208;
        }
      }
      else {
LAB_001a5208:
        this->CheckCMP0000 = true;
        cmPolicies::ApplyPolicyVersion(this,2,4,0,Off);
      }
    }
    else {
      do {
        pcVar10 = pcVar2 + 1;
        iVar7 = std::__cxx11::string::compare
                          ((char *)&((pcVar2->Impl).
                                     super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->LowerCaseName);
        bVar6 = false;
        if (iVar7 == 0) {
          bVar6 = true;
          break;
        }
        pcVar2 = pcVar10;
      } while (pcVar10 != pcVar5);
      if (!bVar6) goto LAB_001a4e99;
    }
    pcVar5 = local_1d8.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_1d8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1d8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar6 = false;
      pcVar2 = local_1d8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pcVar10 = pcVar2 + 1;
        iVar7 = std::__cxx11::string::compare
                          ((char *)&((pcVar2->Impl).
                                     super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->LowerCaseName);
        if (iVar7 == 0) {
          bVar6 = true;
          break;
        }
        pcVar2 = pcVar10;
      } while (pcVar10 != pcVar5);
      if (bVar6) goto LAB_001a553f;
    }
    this_02 = this->GlobalGenerator->CMakeInstance;
    local_238._0_8_ = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,
               "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
               ,"");
    cmake::IssueMessage(this_02,AUTHOR_WARNING,(string *)local_238,local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._0_8_ != &local_228) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_allocated_capacity + 1));
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"project","");
    local_198._M_allocated_capacity = (size_type)&local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Project","");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_allocated_capacity == &local_188) {
      local_228._12_4_ = local_188._12_4_;
      local_228._8_4_ = local_188._8_4_;
      local_238._0_8_ = &local_228;
    }
    else {
      local_238._0_8_ = local_198._M_allocated_capacity;
    }
    local_228._M_allocated_capacity._4_4_ = local_188._M_allocated_capacity._4_4_;
    local_228._M_allocated_capacity._0_4_ = local_188._M_allocated_capacity._0_4_;
    local_238._8_8_ = local_198._8_8_;
    local_198._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_188._M_allocated_capacity._0_4_ = local_188._M_allocated_capacity._0_4_ & 0xffffff00;
    local_218 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
                ((ulong)local_218 & 0xffffffff00000000);
    local_210 = 0;
    local_1b8 = (unsigned_long *)&local_1a8;
    local_198._M_allocated_capacity = (size_type)&local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"__CMAKE_INJECTED_PROJECT_COMMAND__","");
    puVar13 = &local_1f8;
    if (local_1b8 == (unsigned_long *)&local_1a8) {
      uStack_1f0 = uStack_1a0;
      local_208 = puVar13;
    }
    else {
      local_208 = local_1b8;
    }
    local_200 = local_1b0;
    local_1b0 = 0;
    local_1a8 = 0;
    local_1e8 = 0;
    local_1e0 = 0;
    __l._M_len = 2;
    __l._M_array = (iterator)local_238;
    local_1b8 = (unsigned_long *)&local_1a8;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
              (&local_100,__l,&local_23a);
    local_e8[1] = 0;
    local_e8[0] = 0;
    local_260._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8),
               (Implementation **)local_260,
               (allocator<cmListFileFunction::Implementation> *)&local_239,&local_140,local_e8 + 1,
               local_e8,&local_100);
    local_150.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_260._0_8_;
    local_150.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_100);
    lVar11 = -0x60;
    do {
      if (puVar13 != (unsigned_long *)puVar13[-2]) {
        operator_delete((unsigned_long *)puVar13[-2],*puVar13 + 1);
      }
      puVar13 = puVar13 + -6;
      lVar11 = lVar11 + 0x30;
    } while (lVar11 != 0);
    if (local_1b8 != (unsigned_long *)&local_1a8) {
      operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,
                      CONCAT44(local_188._M_allocated_capacity._4_4_,
                               local_188._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
              (&local_1d8.Functions,
               (const_iterator)
               local_1d8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start,&local_150);
    if (local_150.Impl.
        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.Impl.
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
LAB_001a553f:
  __p_00 = (pointer)operator_new(0x18);
  (__p_00->Commands).
  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->Commands).
  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->Commands).
  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  std::__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  reset((__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
         *)&this->Defer,__p_00);
  std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  ~unique_ptr((unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
               *)local_238);
  RunListFile(this,&local_1d8,&local_178,
              (this->Defer)._M_t.
              super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
              .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  reset((__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
         *)&this->Defer,(pointer)0x0);
  if ((cmSystemTools::s_FatalErrorOccurred != false) ||
     (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) {
    local_d8.ReportError = false;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_238,
             &this->UnConfiguredDirectories);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._0_8_;
  if (local_238._0_8_ != local_238._8_8_) {
    do {
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand
                ((cmStateSnapshot *)(paVar12->_M_allocated_capacity + 0x2d0));
      ConfigureSubDirectory(this,(cmMakefile *)paVar12->_M_allocated_capacity);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar12 + 8);
    } while (paVar12 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_238._8_8_);
  }
  AddCMakeDependFilesFromUser(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity - local_238._0_8_);
  }
LAB_001a5620:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            (&local_1d8.Functions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  BuildsystemFileScope::~BuildsystemFileScope(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentSource(), "/CMakeLists.txt");

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace =
    this->Backtrace.Push(cmListFileContext::FromListFilePath(currentStart));

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentBinary(), "/CMakeFiles");
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart);

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (!cm::contains(allowedCommands, func.LowerCaseName())) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        cmPolicies::ApplyPolicyVersion(this, 2, 4, 0,
                                       cmPolicies::WarnCompat::Off);
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project{ "project",
                                  0,
                                  0,
                                  { { "Project", cmListFileArgument::Unquoted,
                                      0 },
                                    { "__CMAKE_INJECTED_PROJECT_COMMAND__",
                                      cmListFileArgument::Unquoted, 0 } } };
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->Defer = cm::make_unique<DeferCommands>();
  this->RunListFile(listFile, currentStart, this->Defer.get());
  this->Defer.reset();
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  auto sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}